

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int mbedtls_x509_get_name(uchar **p,uchar *end,mbedtls_x509_name *cur)

{
  uchar *end_00;
  mbedtls_asn1_named_data *pmVar1;
  mbedtls_x509_name *head;
  uchar *end_set;
  size_t set_len;
  mbedtls_asn1_named_data *pmStack_28;
  int ret;
  mbedtls_x509_name *cur_local;
  uchar *end_local;
  uchar **p_local;
  
  set_len._4_4_ = -0x6e;
  pmStack_28 = cur;
  cur_local = (mbedtls_x509_name *)end;
  end_local = (uchar *)p;
  do {
    set_len._4_4_ =
         mbedtls_asn1_get_tag((uchar **)end_local,(uchar *)cur_local,(size_t *)&end_set,0x31);
    if (set_len._4_4_ != 0) {
      set_len._4_4_ =
           mbedtls_error_add(-0x2380,set_len._4_4_,
                             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509.c"
                             ,0x201);
LAB_0035d1f7:
      mbedtls_asn1_free_named_data_list_shallow(cur->next);
      cur->next = (mbedtls_asn1_named_data *)0x0;
      return set_len._4_4_;
    }
    end_00 = end_set + *(long *)end_local;
    set_len._4_4_ = 0;
    while( true ) {
      set_len._4_4_ = x509_get_attr_type_value((uchar **)end_local,end_00,pmStack_28);
      if (set_len._4_4_ != 0) goto LAB_0035d1f7;
      if (*(uchar **)end_local == end_00) break;
      pmStack_28->next_merged = '\x01';
      pmVar1 = (mbedtls_asn1_named_data *)calloc(1,0x40);
      pmStack_28->next = pmVar1;
      if (pmStack_28->next == (mbedtls_asn1_named_data *)0x0) {
        set_len._4_4_ = -0x2880;
        goto LAB_0035d1f7;
      }
      pmStack_28 = pmStack_28->next;
    }
    if (*(mbedtls_x509_name **)end_local == cur_local) {
      return 0;
    }
    pmVar1 = (mbedtls_asn1_named_data *)calloc(1,0x40);
    pmStack_28->next = pmVar1;
    if (pmStack_28->next == (mbedtls_asn1_named_data *)0x0) {
      set_len._4_4_ = -0x2880;
      goto LAB_0035d1f7;
    }
    pmStack_28 = pmStack_28->next;
  } while( true );
}

Assistant:

int mbedtls_x509_get_name(unsigned char **p, const unsigned char *end,
                          mbedtls_x509_name *cur)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t set_len;
    const unsigned char *end_set;
    mbedtls_x509_name *head = cur;

    /* don't use recursion, we'd risk stack overflow if not optimized */
    while (1) {
        /*
         * parse SET
         */
        if ((ret = mbedtls_asn1_get_tag(p, end, &set_len,
                                        MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SET)) != 0) {
            ret = MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_NAME, ret);
            goto error;
        }

        end_set  = *p + set_len;

        while (1) {
            if ((ret = x509_get_attr_type_value(p, end_set, cur)) != 0) {
                goto error;
            }

            if (*p == end_set) {
                break;
            }

            /* Mark this item as being no the only one in a set */
            cur->next_merged = 1;

            cur->next = mbedtls_calloc(1, sizeof(mbedtls_x509_name));

            if (cur->next == NULL) {
                ret = MBEDTLS_ERR_X509_ALLOC_FAILED;
                goto error;
            }

            cur = cur->next;
        }

        /*
         * continue until end of SEQUENCE is reached
         */
        if (*p == end) {
            return 0;
        }

        cur->next = mbedtls_calloc(1, sizeof(mbedtls_x509_name));

        if (cur->next == NULL) {
            ret = MBEDTLS_ERR_X509_ALLOC_FAILED;
            goto error;
        }

        cur = cur->next;
    }

error:
    /* Skip the first element as we did not allocate it */
    mbedtls_asn1_free_named_data_list_shallow(head->next);
    head->next = NULL;

    return ret;
}